

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t
LossyDctEncoder_execute
          (_func_void_ptr_size_t *alloc_fn,_func_void_void_ptr *free_fn,LossyDctEncoder *e)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  LossyDctEncoder *in_RDX;
  code *in_RSI;
  code *in_RDI;
  float fVar3;
  int chan_4;
  int vy;
  int vx;
  int x_1;
  int y_1;
  int chan_3;
  uint16_t *hquantTable;
  float *quantTable;
  uint16_t h;
  int blockx;
  int blocky;
  int chan_2;
  float src;
  int x;
  float *srcXdr;
  int y;
  int chan_1;
  int chan;
  uint16_t *tmpHalfBufferPtr;
  uint16_t *tmpHalfBuffer;
  int tmpHalfBufferElements;
  uint16_t *currAcComp;
  uint16_t halfZigCoef [64];
  int numBlocksY;
  int numBlocksX;
  DctCoderChannelData *chanData [3];
  int numComp;
  int local_150;
  int local_144;
  int local_140;
  int local_13c;
  int local_124;
  int local_120;
  int local_11c;
  int local_114;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int iVar4;
  int iVar5;
  float *dctvals;
  float *halfZigCoeff;
  int local_e4;
  uint16_t *local_e0;
  uint16_t local_d8 [68];
  int local_50;
  int local_4c;
  float *local_48 [4];
  int local_24;
  LossyDctEncoder *local_20;
  code *local_18;
  code *local_10;
  exr_result_t local_4;
  
  local_24 = in_RDX->_channel_encode_data_count;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar3 = ceilf((float)in_RDX->_width / 8.0);
  local_4c = (int)fVar3;
  fVar3 = ceilf((float)local_20->_height / 8.0);
  local_50 = (int)fVar3;
  local_e0 = (uint16_t *)local_20->_packedAc;
  local_e4 = 0;
  dctvals = (float *)0x0;
  local_20->_numAcComp = 0;
  local_20->_numDcComp = 0;
  for (iVar5 = 0; iVar5 < local_24; iVar5 = iVar5 + 1) {
    local_48[iVar5] = local_20->_channel_encode_data[iVar5]->_dctData;
    if (local_48[iVar5][0x68] == 2.8026e-45) {
      local_e4 = local_20->_width * local_20->_height + local_e4;
    }
  }
  if ((local_e4 == 0) ||
     (dctvals = (float *)(*local_10)((long)local_e4 << 1), dctvals != (float *)0x0)) {
    halfZigCoeff = dctvals;
    for (iVar4 = 0; iVar4 < local_24; iVar4 = iVar4 + 1) {
      if (local_48[iVar4][0x68] == 2.8026e-45) {
        for (in_stack_fffffffffffffefc = 0; in_stack_fffffffffffffefc < local_20->_height;
            in_stack_fffffffffffffefc = in_stack_fffffffffffffefc + 1) {
          for (local_114 = 0; local_114 < local_20->_width; local_114 = local_114 + 1) {
            one_to_native_float(0.0);
            float_to_half(0.0);
            uVar2 = one_from_native16(0);
            *(uint16_t *)((long)dctvals + (long)local_114 * 2) = uVar2;
          }
          *(float **)(*(long *)(local_48[iVar4] + 0x62) + (long)in_stack_fffffffffffffefc * 8) =
               dctvals;
          dctvals = (float *)((long)dctvals + (long)local_20->_width * 2);
        }
      }
    }
    *(uint8_t **)(local_48[0] + 0x60) = local_20->_packedDc;
    for (local_11c = 1; local_11c < local_24; local_11c = local_11c + 1) {
      *(long *)(local_48[local_11c] + 0x60) =
           *(long *)(local_48[local_11c + -1] + 0x60) + (long)(local_4c * local_50) * 2;
    }
    for (local_120 = 0; local_120 < local_50; local_120 = local_120 + 1) {
      for (local_124 = 0; local_124 < local_4c; local_124 = local_124 + 1) {
        for (local_13c = 0; local_13c < local_24; local_13c = local_13c + 1) {
          for (local_140 = 0; local_140 < 8; local_140 = local_140 + 1) {
            for (local_144 = 0; local_144 < 8; local_144 = local_144 + 1) {
              if (local_20->_toNonlinear == (uint16_t *)0x0) {
                one_to_native16(0);
              }
              fVar3 = half_to_float(0);
              local_48[local_13c][local_140 * 8 + local_144] = fVar3;
            }
          }
        }
        if (local_24 == 3) {
          csc709Forward64(local_48[0],local_48[1],local_48[2]);
        }
        for (local_150 = 0; local_150 < local_24; local_150 = local_150 + 1) {
          dctForward8x8(_chan_4);
          quantizeCoeffAndZigXDR
                    ((uint16_t *)halfZigCoeff,dctvals,(float *)CONCAT44(iVar5,iVar4),
                     (uint16_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          puVar1 = *(uint16_t **)(local_48[local_150] + 0x60);
          *(uint16_t **)(local_48[local_150] + 0x60) = puVar1 + 1;
          *puVar1 = local_d8[0];
          local_20->_numDcComp = local_20->_numDcComp + 1;
          LossyDctEncoder_rleAc(local_20,local_d8,&local_e0);
        }
      }
    }
    if (halfZigCoeff != (float *)0x0) {
      (*local_18)(halfZigCoeff);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (
    void* (*alloc_fn) (size_t), void (*free_fn) (void*), LossyDctEncoder* e)
{
    int                  numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) (ceilf ((float) e->_width / 8.0f));
    int numBlocksY = (int) (ceilf ((float) e->_height / 8.0f));

    uint16_t halfZigCoef[64];

    uint16_t* currAcComp            = (uint16_t*) e->_packedAc;
    int       tmpHalfBufferElements = 0;
    uint16_t* tmpHalfBuffer         = NULL;
    uint16_t* tmpHalfBufferPtr      = NULL;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) alloc_fn (
            (size_t) tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (int chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t              h;
            const float* restrict quantTable;
            const uint16_t* restrict hquantTable;

            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            quantTable = e->_quantTableY;
            hquantTable = e->_hquantTableY;
            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, zigzag, and convert to XDR
                //
                quantizeCoeffAndZigXDR (halfZigCoef, chanData[chan]->_dctData,
                                        quantTable, hquantTable);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
                hquantTable = e->_hquantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) free_fn (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}